

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O3

void cmd_xpath_help(void)

{
  puts(
      "xpath [-t TYPE] [-x <additional-tree-file-name>] -e <XPath-expression>\n      <XML-data-file-name> [<JSON-rpc/action-schema-nodeid>]"
      );
  puts("Accepted TYPEs:");
  puts("\tauto       - resolve data type (one of the following) automatically (as pyang does),");
  puts("\t             this option is applicable only in case of XML input data.");
  puts("\tconfig     - LYD_OPT_CONFIG");
  puts("\tget        - LYD_OPT_GET");
  puts("\tgetconfig  - LYD_OPT_GETCONFIG");
  puts("\tedit       - LYD_OPT_EDIT");
  puts("\trpc        - LYD_OPT_RPC");
  puts("\trpcreply   - LYD_OPT_RPCREPLY (last parameter mandatory in this case)");
  puts("\tnotif      - LYD_OPT_NOTIF\n");
  puts("Option -x:");
  puts(
      "\tIf RPC/action/notification/RPC reply (for TYPEs \'rpc\', \'rpcreply\', and \'notif\') includes"
      );
  puts(
      "\tan XPath expression (when/must) that needs access to the configuration data, you can provide"
      );
  puts("\tthem in a file, which will be parsed as \'config\'.");
  return;
}

Assistant:

void
cmd_xpath_help(void)
{
    printf("xpath [-t TYPE] [-x <additional-tree-file-name>] -e <XPath-expression>\n"
           "      <XML-data-file-name> [<JSON-rpc/action-schema-nodeid>]\n");
    printf("Accepted TYPEs:\n");
    printf("\tauto       - resolve data type (one of the following) automatically (as pyang does),\n");
    printf("\t             this option is applicable only in case of XML input data.\n");
    printf("\tconfig     - LYD_OPT_CONFIG\n");
    printf("\tget        - LYD_OPT_GET\n");
    printf("\tgetconfig  - LYD_OPT_GETCONFIG\n");
    printf("\tedit       - LYD_OPT_EDIT\n");
    printf("\trpc        - LYD_OPT_RPC\n");
    printf("\trpcreply   - LYD_OPT_RPCREPLY (last parameter mandatory in this case)\n");
    printf("\tnotif      - LYD_OPT_NOTIF\n\n");
    printf("Option -x:\n");
    printf("\tIf RPC/action/notification/RPC reply (for TYPEs 'rpc', 'rpcreply', and 'notif') includes\n");
    printf("\tan XPath expression (when/must) that needs access to the configuration data, you can provide\n");
    printf("\tthem in a file, which will be parsed as 'config'.\n");
}